

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

uint64_t lzma_memlimit_get(lzma_stream *strm)

{
  lzma_ret lVar1;
  uint64_t local_28;
  uint64_t memusage;
  uint64_t old_memlimit;
  lzma_stream *strm_local;
  
  if ((((strm != (lzma_stream *)0x0) && (strm->internal != (lzma_internal *)0x0)) &&
      ((strm->internal->next).memconfig !=
       (_func_lzma_ret_void_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t *)0x0)) &&
     (old_memlimit = (uint64_t)strm,
     lVar1 = (*(strm->internal->next).memconfig)((strm->internal->next).coder,&local_28,&memusage,0)
     , lVar1 == LZMA_OK)) {
    return memusage;
  }
  return 0;
}

Assistant:

extern LZMA_API(uint64_t)
lzma_memlimit_get(const lzma_stream *strm)
{
	uint64_t old_memlimit;
	uint64_t memusage;

	if (strm == NULL || strm->internal == NULL
			|| strm->internal->next.memconfig == NULL
			|| strm->internal->next.memconfig(
				strm->internal->next.coder,
				&memusage, &old_memlimit, 0) != LZMA_OK)
		return 0;

	return old_memlimit;
}